

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall Clasp::ClaspFacade::SolveData::reset(SolveData *this)

{
  SolveAlgorithm *pSVar1;
  Enumerator *pEVar2;
  Enumerator *in_RDI;
  int in_stack_ffffffffffffffec;
  
  if ((SolveAlgorithm *)in_RDI->queue_ != (SolveAlgorithm *)0x0) {
    SolveStrategy::interrupt((SolveStrategy *)in_RDI,in_stack_ffffffffffffffec);
    SolveStrategy::release((SolveStrategy *)in_RDI);
    in_RDI->queue_ = (SharedQueue *)0x0;
  }
  pSVar1 = SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject>::get
                     ((SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject> *)0x122396);
  if (pSVar1 != (SolveAlgorithm *)0x0) {
    pSVar1 = SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject>::operator->
                       ((SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject> *)0x1223aa);
    (*pSVar1->_vptr_SolveAlgorithm[3])();
  }
  pEVar2 = SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject>::get
                     ((SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject> *)0x1223bd);
  if (pEVar2 != (Enumerator *)0x0) {
    SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject> *)0x1223cd);
    Enumerator::reset(in_RDI);
  }
  *(undefined1 *)((long)&(in_RDI->model_).values + 6) = 0;
  *(undefined1 *)((long)&(in_RDI->model_).values + 5) = 0;
  return;
}

Assistant:

void ClaspFacade::SolveData::reset() {
	if (active)     { active->interrupt(SolveStrategy::SIGCANCEL); active->release(); active = 0; }
	if (algo.get()) { algo->resetSolve(); }
	if (en.get())   { en->reset(); }
	prepared = solved = false;
}